

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

int Abc_TtCompare2VarCofsRev(word *pTruth,int nWords,int iVar,int Num1,int Num2)

{
  ulong *puVar1;
  ulong *puVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  byte bVar6;
  word *pwVar7;
  ulong uVar8;
  long lVar9;
  word *pwVar10;
  word *pwVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  
  if (Num2 <= Num1) {
    __assert_fail("Num1 < Num2 && Num2 < 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauCanon.c"
                  ,0xe8,"int Abc_TtCompare2VarCofsRev(word *, int, int, int, int)");
  }
  bVar6 = (byte)iVar;
  if (iVar < 5) {
    uVar8 = (ulong)(uint)nWords;
    do {
      if ((int)uVar8 < 1) {
        return 0;
      }
      lVar9 = uVar8 - 1;
      uVar8 = uVar8 - 1;
      uVar15 = pTruth[lVar9] >> ((byte)(Num1 << (bVar6 & 0x1f)) & 0x3f) & s_CMasks6[iVar];
      uVar13 = pTruth[lVar9] >> ((byte)(Num2 << (bVar6 & 0x1f)) & 0x3f) & s_CMasks6[iVar];
    } while (uVar15 == uVar13);
    bVar16 = uVar15 < uVar13;
  }
  else {
    if (iVar != 5) {
      bVar6 = bVar6 - 6;
      iVar12 = 1 << (bVar6 & 0x1f);
      if ((uint)iVar < 7) {
        iVar12 = 1;
        bVar6 = 0;
      }
      if (nWords < 4) {
        __assert_fail("nWords >= 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauCanon.c"
                      ,0x10e,"int Abc_TtCompare2VarCofsRev(word *, int, int, int, int)");
      }
      uVar8 = (ulong)(uint)nWords;
      lVar9 = (long)(iVar12 * 4);
      pwVar7 = pTruth + (uVar8 - lVar9);
      if (pwVar7 < pTruth) {
        return 0;
      }
      lVar14 = (long)iVar12;
      pwVar10 = pTruth + ((uVar8 + (long)(Num2 << (bVar6 & 0x1f)) + lVar14 + -1) - lVar9);
      pwVar11 = pTruth + ((uVar8 + (long)(Num1 << (bVar6 & 0x1f)) + lVar14 + -1) - lVar9);
      do {
        lVar5 = 0;
        while (0 < lVar14 + lVar5) {
          puVar1 = pwVar11 + lVar5;
          puVar2 = pwVar10 + lVar5;
          lVar5 = lVar5 + -1;
          if (*puVar1 != *puVar2) {
            bVar16 = *puVar1 < *puVar2;
            goto LAB_00499cb0;
          }
        }
        pwVar7 = pwVar7 + -lVar9;
        pwVar10 = pwVar10 + -lVar9;
        pwVar11 = pwVar11 + -lVar9;
        if (pwVar7 < pTruth) {
          return 0;
        }
      } while( true );
    }
    if (nWords < 2) {
      __assert_fail("nWords >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauCanon.c"
                    ,0x102,"int Abc_TtCompare2VarCofsRev(word *, int, int, int, int)");
    }
    pwVar7 = pTruth + (uint)nWords;
    do {
      pwVar7 = pwVar7 + -2;
      if (pwVar7 < pTruth) {
        return 0;
      }
      uVar3 = *(uint *)((long)pwVar7 + (ulong)(uint)Num1 * 4);
      uVar4 = *(uint *)((long)pwVar7 + (ulong)(uint)Num2 * 4);
    } while (uVar3 == uVar4);
    bVar16 = uVar3 < uVar4;
  }
LAB_00499cb0:
  return -(uint)bVar16 | 1;
}

Assistant:

static inline int Abc_TtCompare2VarCofsRev( word * pTruth, int nWords, int iVar, int Num1, int Num2 )
{
    assert( Num1 < Num2 && Num2 < 4 );
    if ( nWords == 1 )
    {
        word Cof1 = (pTruth[0] >> (Num1 * (1 << iVar))) & s_CMasks6[iVar];
        word Cof2 = (pTruth[0] >> (Num2 * (1 << iVar))) & s_CMasks6[iVar];
        if ( Cof1 != Cof2 )
            return Cof1 < Cof2 ? -1 : 1;
        return 0;
    }
	if ( iVar <= 4 )
	{
        word Cof1, Cof2;
		int w, shift = (1 << iVar);
		for ( w = nWords - 1; w >= 0; w-- )
        {
            Cof1 = (pTruth[w] >> Num1 * shift) & s_CMasks6[iVar];
            Cof2 = (pTruth[w] >> Num2 * shift) & s_CMasks6[iVar];
            if ( Cof1 != Cof2 )
                return Cof1 < Cof2 ? -1 : 1;
        }
        return 0;
	}
	if ( iVar == 5 )
	{
        unsigned * pTruthU = (unsigned *)pTruth;
        unsigned * pLimitU = (unsigned *)(pTruth + nWords);
        assert( nWords >= 2 );
		for ( pLimitU -= 4; pLimitU >= pTruthU; pLimitU -= 4 )
            if ( pLimitU[Num1] != pLimitU[Num2] )
                return pLimitU[Num1] < pLimitU[Num2] ? -1 : 1;
        return 0;
	}
	// if ( iVar > 5 )
	{
        word * pLimit = pTruth + nWords;
		int i, iStep = Abc_TtWordNum(iVar);
        int Offset1 = Num1*iStep;
        int Offset2 = Num2*iStep;
        assert( nWords >= 4 );
		for ( pLimit -= 4*iStep; pLimit >= pTruth; pLimit -= 4*iStep )
			for ( i = iStep - 1; i >= 0; i-- )
                if ( pLimit[i + Offset1] != pLimit[i + Offset2] )
                    return pLimit[i + Offset1] < pLimit[i + Offset2] ? -1 : 1;
        return 0;
	}	
}